

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_csupport.cpp
# Opt level: O1

size_t ompc_get_affinity_format(char *buffer,size_t size)

{
  char *__src;
  size_t sVar1;
  
  if (__kmp_init_serial == 0) {
    __kmp_serial_initialize();
  }
  __src = __kmp_affinity_format;
  sVar1 = strlen(__kmp_affinity_format);
  if (size != 0 && buffer != (char *)0x0) {
    if (sVar1 + 1 < size) {
      strncpy(buffer,__src,sVar1 + 1);
    }
    else {
      strncpy(buffer,__src,size - 1);
      buffer[size - 1] = '\0';
    }
  }
  return sVar1;
}

Assistant:

size_t ompc_get_affinity_format(char *buffer, size_t size) {
  size_t format_size;
  if (!__kmp_init_serial) {
    __kmp_serial_initialize();
  }
  format_size = KMP_STRLEN(__kmp_affinity_format);
  if (buffer && size) {
    __kmp_strncpy_truncate(buffer, size, __kmp_affinity_format,
                           format_size + 1);
  }
  return format_size;
}